

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chains<VkAttachmentDescription2>
          (Impl *this,VkAttachmentDescription2 *ts,uint32_t count,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  void **out_pnext;
  
  out_pnext = &ts->pNext;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (count == uVar3) break;
    bVar2 = copy_pnext_chain(this,*out_pnext,alloc,out_pnext,dynamic_state_info,state_flags);
    out_pnext = out_pnext + 7;
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return count <= uVar3;
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chains(const T *ts, uint32_t count, ScratchAllocator &alloc,
                                            const DynamicStateInfo *dynamic_state_info,
                                            VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	for (uint32_t i = 0; i < count; i++)
		if (!copy_pnext_chain(ts[i].pNext, alloc, &const_cast<T&>(ts[i]).pNext, dynamic_state_info, state_flags))
			return false;
	return true;
}